

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallGenerator::AddInstallRule
          (cmInstallGenerator *this,ostream *os,string *dest,cmInstallType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,bool optional,char *permissions_file,char *permissions_dir,char *rename,
          char *literal_args,Indent indent)

{
  pointer pbVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  char *pcVar5;
  string *file;
  pointer pbVar6;
  const_iterator __begin2;
  string stype;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  if (type < (cmInstallType_DIRECTORY|cmInstallType_STATIC_LIBRARY)) {
    std::__cxx11::string::assign((char *)&local_50);
  }
  pcVar5 = (char *)(ulong)(uint)indent.Level;
  ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  bVar2 = cmsys::SystemTools::FileIsFullPath(dest);
  if (bVar2) {
    std::operator<<(os,"list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n");
    poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar4," \"");
    pbVar1 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = true;
    for (pbVar6 = (files->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1)
    {
      if (!bVar2) {
        std::operator<<(os,";");
      }
      poVar4 = std::operator<<(os,(string *)dest);
      std::operator<<(poVar4,"/");
      if ((rename == (char *)0x0) || (*rename == '\0')) {
        cmsys::SystemTools::GetFilenameName(&local_70,pbVar6);
        std::operator<<(os,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        std::operator<<(os,rename);
      }
      bVar2 = false;
    }
    std::operator<<(os,"\")\n");
    poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar4,"if(CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n");
    poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar4 = ::operator<<(poVar4,(cmScriptGeneratorIndent)indent.Level);
    poVar4 = std::operator<<(poVar4,"message(WARNING \"ABSOLUTE path INSTALL ");
    std::operator<<(poVar4,"DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n");
    poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar4,"endif()\n");
    poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar4,"if(CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n");
    poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar4 = ::operator<<(poVar4,(cmScriptGeneratorIndent)indent.Level);
    poVar4 = std::operator<<(poVar4,"message(FATAL_ERROR \"ABSOLUTE path INSTALL ");
    poVar4 = std::operator<<(poVar4,"DESTINATION forbidden (by caller): ");
    std::operator<<(poVar4,"${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n");
    poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    pcVar5 = "endif()\n";
    std::operator<<(poVar4,"endif()\n");
  }
  ConvertToAbsoluteDestination(&local_70,(cmInstallGenerator *)pcVar5,dest);
  poVar4 = std::operator<<(os,"file(INSTALL DESTINATION \"");
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  poVar4 = std::operator<<(poVar4,"\" TYPE ");
  std::operator<<(poVar4,(string *)&local_50);
  if (optional) {
    std::operator<<(os," OPTIONAL");
  }
  uVar3 = this->Message - MessageAlways;
  if (uVar3 < 3) {
    std::operator<<(os,&DAT_00412bfc + *(int *)(&DAT_00412bfc + (ulong)uVar3 * 4));
  }
  if ((permissions_file != (char *)0x0) && (*permissions_file != '\0')) {
    poVar4 = std::operator<<(os," PERMISSIONS");
    std::operator<<(poVar4,permissions_file);
  }
  if ((permissions_dir != (char *)0x0) && (*permissions_dir != '\0')) {
    poVar4 = std::operator<<(os," DIR_PERMISSIONS");
    std::operator<<(poVar4,permissions_dir);
  }
  if ((rename != (char *)0x0) && (*rename != '\0')) {
    poVar4 = std::operator<<(os," RENAME \"");
    poVar4 = std::operator<<(poVar4,rename);
    std::operator<<(poVar4,"\"");
  }
  std::operator<<(os," FILES");
  pbVar6 = (files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pbVar1 - (long)pbVar6 == 0x20) {
    poVar4 = std::operator<<(os," \"");
    poVar4 = std::operator<<(poVar4,(string *)
                                    (files->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
    pcVar5 = "\"";
LAB_00289954:
    std::operator<<(poVar4,pcVar5);
    if ((literal_args == (char *)0x0) || (*literal_args == '\0')) goto LAB_00289984;
  }
  else {
    for (; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
      poVar4 = std::operator<<(os,"\n");
      poVar4 = ::operator<<(poVar4,(cmScriptGeneratorIndent)indent.Level);
      poVar4 = std::operator<<(poVar4,"  \"");
      poVar4 = std::operator<<(poVar4,(string *)pbVar6);
      std::operator<<(poVar4,"\"");
    }
    poVar4 = std::operator<<(os,"\n");
    poVar4 = ::operator<<(poVar4,(cmScriptGeneratorIndent)indent.Level);
    pcVar5 = " ";
    std::operator<<(poVar4," ");
    poVar4 = os;
    if ((literal_args == (char *)0x0) || (*literal_args == '\0')) goto LAB_00289954;
  }
  std::operator<<(os,literal_args);
LAB_00289984:
  std::operator<<(os,")\n");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmInstallGenerator::AddInstallRule(
  std::ostream& os, std::string const& dest, cmInstallType type,
  std::vector<std::string> const& files, bool optional /* = false */,
  const char* permissions_file /* = 0 */,
  const char* permissions_dir /* = 0 */, const char* rename /* = 0 */,
  const char* literal_args /* = 0 */, Indent indent)
{
  // Use the FILE command to install the file.
  std::string stype;
  switch (type) {
    case cmInstallType_DIRECTORY:
      stype = "DIRECTORY";
      break;
    case cmInstallType_PROGRAMS:
      stype = "PROGRAM";
      break;
    case cmInstallType_EXECUTABLE:
      stype = "EXECUTABLE";
      break;
    case cmInstallType_STATIC_LIBRARY:
      stype = "STATIC_LIBRARY";
      break;
    case cmInstallType_SHARED_LIBRARY:
      stype = "SHARED_LIBRARY";
      break;
    case cmInstallType_MODULE_LIBRARY:
      stype = "MODULE";
      break;
    case cmInstallType_FILES:
      stype = "FILE";
      break;
  }
  os << indent;
  if (cmSystemTools::FileIsFullPath(dest)) {
    os << "list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n";
    os << indent << " \"";
    bool firstIteration = true;
    for (std::string const& file : files) {
      if (!firstIteration) {
        os << ";";
      }
      os << dest << "/";
      if (rename && *rename) {
        os << rename;
      } else {
        os << cmSystemTools::GetFilenameName(file);
      }
      firstIteration = false;
    }
    os << "\")\n";
    os << indent << "if(CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n";
    os << indent << indent << "message(WARNING \"ABSOLUTE path INSTALL "
       << "DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n";
    os << indent << "endif()\n";

    os << indent << "if(CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n";
    os << indent << indent << "message(FATAL_ERROR \"ABSOLUTE path INSTALL "
       << "DESTINATION forbidden (by caller): "
       << "${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n";
    os << indent << "endif()\n";
  }
  std::string absDest = this->ConvertToAbsoluteDestination(dest);
  os << "file(INSTALL DESTINATION \"" << absDest << "\" TYPE " << stype;
  if (optional) {
    os << " OPTIONAL";
  }
  switch (this->Message) {
    case MessageDefault:
      break;
    case MessageAlways:
      os << " MESSAGE_ALWAYS";
      break;
    case MessageLazy:
      os << " MESSAGE_LAZY";
      break;
    case MessageNever:
      os << " MESSAGE_NEVER";
      break;
  }
  if (permissions_file && *permissions_file) {
    os << " PERMISSIONS" << permissions_file;
  }
  if (permissions_dir && *permissions_dir) {
    os << " DIR_PERMISSIONS" << permissions_dir;
  }
  if (rename && *rename) {
    os << " RENAME \"" << rename << "\"";
  }
  os << " FILES";
  if (files.size() == 1) {
    os << " \"" << files[0] << "\"";
  } else {
    for (std::string const& f : files) {
      os << "\n" << indent << "  \"" << f << "\"";
    }
    os << "\n" << indent << " ";
    if (!(literal_args && *literal_args)) {
      os << " ";
    }
  }
  if (literal_args && *literal_args) {
    os << literal_args;
  }
  os << ")\n";
}